

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardChars.h
# Opt level: O1

char16 __thiscall
UnifiedRegex::CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::ToCanonical
          (CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_> *this,char16 c)

{
  CaseMapper<UnifiedRegex::TrivialCaseMapper> *this_00;
  bool bVar1;
  BOOL BVar2;
  unsigned_long uVar3;
  Type TVar4;
  Type *pTVar5;
  uint k;
  undefined6 in_register_00000032;
  Type local_28;
  unsigned_long lastOcc;
  
  k = (uint)CONCAT62(in_register_00000032,c);
  if (k < 0x100) {
    BVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                      (&this->toEquivs,k);
    if (BVar2 == 0) {
      uVar3 = (this->toEquivs).defv;
    }
    else {
      uVar3 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                        (&this->toEquivs,k);
    }
  }
  else {
    bVar1 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                      (&this->toEquivs,k,&local_28);
    pTVar5 = &(this->toEquivs).defv;
    if (bVar1) {
      pTVar5 = &local_28;
    }
    uVar3 = *pTVar5;
  }
  if (uVar3 == 0xffffffffffffffff) {
    this_00 = this->fallbackMapper;
    if ((ushort)c < 0x100) {
      BVar2 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                        (&this_00->toEquivs,k);
      if (BVar2 == 0) {
        TVar4 = (this_00->toEquivs).defv;
      }
      else {
        TVar4 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                          (&this_00->toEquivs,k);
      }
    }
    else {
      bVar1 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                        (&this_00->toEquivs,k,&local_28);
      pTVar5 = &(this_00->toEquivs).defv;
      if (bVar1) {
        pTVar5 = &local_28;
      }
      TVar4 = *pTVar5;
    }
    uVar3 = TVar4 & 0xffffffff;
    if (TVar4 == 0xffffffffffffffff) {
      uVar3 = CONCAT62(in_register_00000032,c) & 0xffffffff;
    }
  }
  return (char16)uVar3;
}

Assistant:

inline char16 ToCanonical(char16 c) const
        {
            uint64 r = toEquivs.Get(c);
            return r == EQUIV_MISSING ? fallbackMapper->ToCanonical(c) : Chars<char16>::UTC(r & 0xffff);
        }